

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O2

CTPNStmTop * __thiscall CTcParser::parse_grammar(CTcParser *this,int *err,int replace,int modify)

{
  vm_obj_id_t obj_id;
  CTcSymProp *prop_sym;
  CTcTokenizer *pCVar1;
  tc_toktyp_t tVar2;
  tc_toktyp_t tVar3;
  CTcToken *pCVar4;
  CTcSymObjBase *this_00;
  CTPNStmTop *pCVar5;
  CTPNListBase *this_01;
  CTcPrsNode *pCVar6;
  char *siz;
  size_t len;
  ulong uVar7;
  int local_48c;
  char *local_488;
  char *local_480;
  CTcGramProdEntry *local_478;
  size_t local_470;
  size_t local_468;
  char *local_460;
  CTcSymObj *mod_orig_sym;
  int *local_448;
  int trans;
  uint uStack_43c;
  anon_union_24_10_6f92a4ee_for_val_ aStack_438;
  byte local_420;
  char tag_buf [192];
  CTcGramPropArrows arrows;
  
  mod_orig_sym = (CTcSymObj *)0x0;
  tVar2 = CTcTokenizer::next(G_tok);
  if (tVar2 == TOKT_SYM) {
    pCVar4 = CTcTokenizer::copycur(G_tok);
    local_480 = pCVar4->text_;
    len = pCVar4->text_len_;
    siz = local_480;
    local_478 = declare_gramprod(this,local_480,len);
  }
  else {
    siz = (char *)0x2b82;
    CTcTokenizer::log_error_curtok(G_tok,0x2b82);
    local_480 = "?";
    len = 1;
    local_478 = (CTcGramProdEntry *)0x0;
  }
  tVar2 = CTcTokenizer::next(G_tok);
  pCVar1 = G_tok;
  if (tVar2 == TOKT_LPAR) {
    local_448 = err;
    CTcTokenizer::next(G_tok);
    pCVar1 = G_tok;
    local_460 = (G_tok->curtok_).text_;
    local_468 = (G_tok->curtok_).text_len_;
    uVar7 = 0xbe - len;
    if (local_468 < 0xbe - len) {
      uVar7 = local_468;
    }
    memcpy(tag_buf,local_480,len);
    tag_buf[len] = '(';
    memcpy(tag_buf + len + 1,local_460,uVar7);
    tag_buf[len + uVar7 + 1] = ')';
    local_470 = len + uVar7 + 2;
    local_488 = CTcTokenizer::store_source(pCVar1,tag_buf,local_470);
    tVar3 = CTcTokenizer::next(G_tok);
    if (tVar3 == TOKT_RPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2bb1);
    }
    arrows.prop[0]._0_4_ = 1;
    _trans = (undefined **)((ulong)uStack_43c << 0x20);
    this_00 = &find_or_def_obj(this,local_488,local_470,replace,modify,(int *)&arrows,&mod_orig_sym,
                               (CTcSymMetaclass **)0x0,&trans)->super_CTcSymObjBase;
    local_48c = 0;
    err = local_448;
  }
  else {
    if ((replace == 0 && modify == 0) && ((G_tok->curtok_).typ_ == TOKT_SEM)) {
      if (local_478 != (CTcGramProdEntry *)0x0) {
        local_478->field_0x20 = local_478->field_0x20 | 1;
      }
      CTcTokenizer::next(pCVar1);
      return (CTPNStmTop *)0x0;
    }
    this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)siz);
    obj_id = G_cg->next_obj_;
    G_cg->next_obj_ = obj_id + 1;
    CTcSymObj::CTcSymObj
              ((CTcSymObj *)this_00,".anon",5,0,obj_id,0,TC_META_TADSOBJ,(CTcDictEntry *)0x0);
    local_48c = 1;
    if (replace != 0 || modify != 0) {
      CTcTokenizer::log_error(0x2bc0);
    }
    local_460 = (char *)0x0;
    local_488 = local_480;
    local_468 = 0;
    local_470 = len;
  }
  if ((G_tok->curtok_).typ_ == TOKT_COLON) {
    CTcTokenizer::next(G_tok);
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2b83);
  }
  if (this_00 != (CTcSymObjBase *)0x0) {
    this_00->field_0xb8 = this_00->field_0xb8 | 0x20;
  }
  arrows.cnt = 0;
  if ((modify == 0) || ((G_tok->curtok_).typ_ != TOKT_COLON)) {
    if ((tVar2 == TOKT_LPAR) && (this_00 != (CTcSymObjBase *)0x0)) {
      local_478 = CTcSymObjBase::create_grammar_entry(this_00,local_480,len);
    }
    _trans = &PTR_look_up_prop_003029e8;
    aStack_438.listval_.l_ = (CTPNList *)this;
    parse_gram_alts(this,err,(CTcSymObj *)this_00,local_478,&arrows,(CTcGramAltFuncs *)&trans);
    if (*err != 0) {
      return (CTPNStmTop *)0x0;
    }
  }
  else {
    CTcTokenizer::next(G_tok);
  }
  pCVar5 = (CTPNStmTop *)
           parse_object_body(this,err,(CTcSymObj *)this_00,1,local_48c,1,0,modify,mod_orig_sym,0,
                             (CTcSymMetaclass *)0x0,(tcprs_term_info *)0x0,0);
  if (pCVar5 == (CTPNStmTop *)0x0) {
    return (CTPNStmTop *)0x0;
  }
  _trans = (undefined **)((ulong)_trans & 0xffffffff00000000);
  local_420 = local_420 & 0xfe;
  this_01 = (CTPNListBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x50,(size_t)err);
  (this_01->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->cnt_ = 0;
  this_01->head_ = (CTPNListEle *)0x0;
  this_01->tail_ = (CTPNListEle *)0x0;
  *(undefined8 *)&this_01->const_val_ = 0;
  (this_01->const_val_).val_.intval_ = 0;
  (this_01->const_val_).val_.floatval_.len_ = 0;
  *(undefined8 *)((long)&(this_01->const_val_).val_ + 0x10) = 0;
  *(undefined8 *)&(this_01->const_val_).field_0x20 = 0;
  *(undefined8 *)&this_01->field_0x48 = 0;
  CTPNList::CTPNList((CTPNList *)this_01);
  CTcConstVal::set_sstr((CTcConstVal *)&trans,local_488,local_470);
  pCVar6 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)local_488);
  (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR___cxa_pure_virtual_003091b0;
  *(undefined4 *)&pCVar6[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
  pCVar6[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)_trans;
  pCVar6[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)aStack_438.intval_;
  pCVar6[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)aStack_438.floatval_.len_;
  pCVar6[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)aStack_438._16_8_;
  *(byte *)&pCVar6[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = local_420;
  (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0030e698;
  CTPNListBase::add_element(this_01,pCVar6);
  for (uVar7 = 0; uVar7 < arrows.cnt; uVar7 = uVar7 + 1) {
    pCVar6 = create_sym_node(this,*(char **)((long)&(arrows.prop[uVar7]->super_CTcSymPropBase).
                                                    super_CTcSymbol.super_CTcSymbolBase.
                                                    super_CVmHashEntryCS.super_CVmHashEntry + 0x10),
                             *(size_t *)
                              ((long)&(arrows.prop[uVar7]->super_CTcSymPropBase).super_CTcSymbol.
                                      super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry +
                              0x18));
    CTPNListBase::add_element(this_01,pCVar6);
  }
  CTPNObjDef::add_prop((CTPNObjDef *)(pCVar5 + 1),this->graminfo_prop_,(CTcPrsNode *)this_01,0,0);
  CTcConstVal::set_sstr((CTcConstVal *)&trans,local_460,local_468);
  prop_sym = this->gramtag_prop_;
  pCVar6 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)local_460);
  (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR___cxa_pure_virtual_003091b0;
  *(undefined4 *)&pCVar6[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
  pCVar6[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)_trans;
  pCVar6[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)aStack_438.intval_;
  pCVar6[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)aStack_438.floatval_.len_;
  pCVar6[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)aStack_438._16_8_;
  *(byte *)&pCVar6[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = local_420;
  (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0030e698;
  CTPNObjDef::add_prop((CTPNObjDef *)(pCVar5 + 1),prop_sym,pCVar6,0,0);
  return pCVar5;
}

Assistant:

CTPNStmTop *CTcParser::parse_grammar(int *err, int replace, int modify)
{
    /* no GrammarProd object yet */
    CTcSymObj *gram_obj = 0;

    /* presume we're not modifying anything */
    CTcSymObj *mod_orig_sym = 0;

    /* presume we won't need a private production object */
    int need_private_prod = FALSE;

    /* presume we won't find a valid production name */
    CTcToken prod_name;
    prod_name.set_text("?", 1);
    CTcGramProdEntry *prod = 0;

    /* presume it will be anonymous (i.e., no name tag) */
    int is_anon = TRUE;

    /* skip the 'grammar' token and check for the production name */
    if (G_tok->next() != TOKT_SYM)
    {
        /* log an error, then proceed without a symbol name */
        G_tok->log_error_curtok(TCERR_GRAMMAR_REQ_SYM);
    }
    else
    {
        /* remember the production name */
        prod_name = *G_tok->copycur();

        /* find or create the 'grammar production' entry */
        prod = declare_gramprod(prod_name.get_text(),
                                prod_name.get_text_len());
    }

    /* use the production name as the name tag */
    char tag_buf[TOK_SYM_MAX_LEN*2 + 32];
    const char *name_tag = prod_name.get_text();
    size_t name_tag_len = prod_name.get_text_len();

    /* presume there'll be no sub-tag */
    const char *sub_tag = 0;
    size_t sub_tag_len = 0;

    /* check for the optional name-tag token */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the paren - the name token follows */
        G_tok->next();

        /* 
         *   limit the added copying so we don't overflow our buffer - note
         *   that we need two bytes for parens 
         */
        size_t copy_len = G_tok->getcur()->get_text_len();
        if (copy_len > sizeof(tag_buf) - name_tag_len - 2)
            copy_len = sizeof(tag_buf) - name_tag_len - 2;

        /* remember the sub-tag */
        sub_tag = G_tok->getcur()->get_text();
        sub_tag_len = G_tok->getcur()->get_text_len();

        /* build the name */
        memcpy(tag_buf, name_tag, name_tag_len);
        tag_buf[name_tag_len] = '(';
        memcpy(tag_buf + name_tag_len + 1,
               G_tok->getcur()->get_text(), copy_len);
        tag_buf[name_tag_len + 1 + copy_len] = ')';

        /* store the tag in tokenizer memory */
        name_tag_len += 2 + copy_len;
        name_tag = G_tok->store_source(tag_buf, name_tag_len);

        /* require the closing paren */
        if (G_tok->next() == TOKT_RPAR)
        {
            /* found it - skip it */
            G_tok->next();
        }
        else
        {
            /* flag the error, but proceed as though it was there */
            G_tok->log_error_curtok(TCERR_GRAMMAR_REQ_NAME_RPAR);
        }

        /*
         *   There's a tag, so the grammar match object has a symbol name
         *   given by the full "prod(tag)" string.  Note that grammar match
         *   definitions are inherently classes.  
         */
        int is_class = TRUE;
        int trans = FALSE;
        gram_obj = find_or_def_obj(name_tag, name_tag_len,
                                   replace, modify, &is_class,
                                   &mod_orig_sym, 0, &trans);

        /* note that the object is named */
        is_anon = FALSE;

        /*
         *   Since this is a named grammar match object, we must keep the
         *   list of grammar rules defined here in a private list.  At link
         *   time, we'll merge this private grammar rule list with the
         *   master list for the production, but we must keep a private list
         *   until link time in case this match object is modified or
         *   replaced.  
         */
        need_private_prod = TRUE;
    }
    else if (!replace && !modify && G_tok->cur() == TOKT_SEM)
    {
        /* 
         *   It's an empty 'grammar x;' statement, with no rule definition
         *   and no properties.  This is a simple declaration of the
         *   production name and defines no rules for it; the only thing we
         *   have to do is mark the production object as explicitly declared.
         */
        if (prod != 0)
            prod->set_declared(TRUE);

        /* skip the semicolon */
        G_tok->next();

        /* 
         *   we're done - a simple grammar production declaration generates
         *   no parse tree object 
         */
        return 0;
    }
    else
    {
        /* 
         *   There's no tag, so the grammar match object is anonymous.
         *   Create a new anonymous object symbol for it.  
         */
        gram_obj = new CTcSymObj(".anon", 5, FALSE, G_cg->new_obj_id(),
                                 FALSE, TC_META_TADSOBJ, 0);

        /* 
         *   'replace' and 'modify' can only be used with tagged grammar
         *   rules, since that's the only way we can refer to a specific rule
         *   previously defined 
         */
        if (replace || modify)
            G_tok->log_error(TCERR_GRAMMAR_MOD_REQ_TAG);
    }

    /* check for and skip the required colon */
    if (G_tok->cur() == TOKT_COLON)
    {
        /* it's there - skip it and proceed */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, then proceed on the assumption that the colon
         *   was simply omitted 
         */
        G_tok->log_error_curtok(TCERR_GRAMMAR_REQ_COLON);
    }

    /* 
     *   mark it as a class - this object exists as a factory for match tree
     *   instances 
     */
    if (gram_obj != 0)
        gram_obj->set_is_class(TRUE);

    /*
     *   If we're modifying the rule, check for an empty rule list.  With
     *   'modify', an empty rule list has the special meaning that we retain
     *   the original rule list of the base object being modified.  
     */
    CTcGramPropArrows arrows;
    if (modify && G_tok->cur() == TOKT_COLON)
    {
        /* 
         *   This is a 'modify', and the rule list is empty.  This means that
         *   we're to leave the original rule list of the base object intact,
         *   so we don't need to flatten the input syntax (since there's no
         *   input syntax to flatten), we don't need to create a new private
         *   list (since we want to leave the existing private list intact),
         *   and we don't need to set up the first alternative for the rule
         *   (since there will be no alternatives at all).  
         */
        G_tok->next();
    }
    else
    {
        /* 
         *   We don't have an empty 'modify' rule list, so we're defining a
         *   rule list for this production.  If we decided that we need to
         *   store the list in a private list, create the private list.  
         */
        if (need_private_prod && gram_obj != 0)
            prod = gram_obj->create_grammar_entry(
                prod_name.get_text(), prod_name.get_text_len());

        /* parse the token specification list */
        CTcGramAltFuncsStatic funcs(this);
        parse_gram_alts(err, gram_obj, prod, &arrows, &funcs);
        if (*err != 0)
            return 0;
    }

    /* parse the object body */
    CTPNStmObject *stm = parse_object_body(
        err, gram_obj, TRUE, is_anon, TRUE, FALSE, modify, mod_orig_sym,
        0, 0, 0, FALSE);

    /*
     *   Add the grammarInfo property.  This property is a method that
     *   returns a list whose first element is the match's name tag, and
     *   whose subsequent elements are the arrow-assigned properties.
     *   
     *   This is only necessary if we managed to create a statement object.  
     */
    if (stm != 0)
    {
        CTPNList *lst;
        CTcConstVal cval;
        size_t i;

        /* create the list expression */
        lst = new CTPNList();

        /* add the name-tag string element */
        cval.set_sstr(name_tag, name_tag_len);
        lst->add_element(new CTPNConst(&cval));

        /* add each property to the list */
        for (i = 0 ; i < arrows.cnt ; ++i)
        {
            /* add a node to evaluate this property symbol */
            lst->add_element(create_sym_node(arrows.prop[i]->get_sym(),
                                             arrows.prop[i]->get_sym_len()));
        }

        /* add a property for this */
        stm->add_prop(graminfo_prop_, lst, FALSE, FALSE);

        /* add a grammarTag property with the tag name */
        cval.set_sstr(sub_tag, sub_tag_len);
        stm->add_prop(gramtag_prop_, new CTPNConst(&cval), FALSE, FALSE);
    }

    /* return the object definition statement */
    return stm;
}